

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateInnerProductLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  string *layerName;
  WeightParams *pWVar3;
  WeightParams *bias;
  Result local_1b0;
  allocator local_181;
  string local_180;
  Result local_160;
  InnerProductLayerParams *local_138;
  InnerProductLayerParams *params;
  string local_128;
  Result local_108;
  allocator local_d9;
  string local_d8;
  Result local_b8;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"InnerProduct",&local_d9);
    validateInputOutputRankEquality(&local_b8,pNVar1,&local_d8,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_b8);
    Result::~Result(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,"InnerProduct",(allocator *)((long)&params + 7));
    validateRankCount(&local_108,pNVar1,&local_128,1,5,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  local_138 = Specification::NeuralNetworkLayer::innerproduct(local_20);
  bVar2 = Specification::InnerProductLayerParams::int8dynamicquantize(local_138);
  if (bVar2) {
    pWVar3 = Specification::InnerProductLayerParams::weights(local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"InnerProduct",&local_181);
    layerName = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    validateInt8Requirements(&local_160,pWVar3,&local_180,layerName);
    Result::operator=(__return_storage_ptr__,&local_160);
    Result::~Result(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  pNVar1 = local_20;
  pWVar3 = Specification::InnerProductLayerParams::weights(local_138);
  bias = Specification::InnerProductLayerParams::bias(local_138);
  validateInnerProductWeightsBias(&local_1b0,pNVar1,pWVar3,bias);
  Result::operator=(__return_storage_ptr__,&local_1b0);
  Result::~Result(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateInnerProductLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "InnerProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "InnerProduct", 1, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.innerproduct();
    if (params.int8dynamicquantize()) {
        r = validateInt8Requirements(params.weights(), "InnerProduct", layer.name());
        if (!r.good()) {return r;}
    }

    r = validateInnerProductWeightsBias(layer, params.weights(), params.bias());

    return r;
}